

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_meta.cpp
# Opt level: O2

MPP_RET mpp_meta_inc_ref(MppMeta meta)

{
  if (meta != (MppMeta)0x0) {
    LOCK();
    *(int *)((long)meta + 0x2c) = *(int *)((long)meta + 0x2c) + 1;
    UNLOCK();
    return MPP_OK;
  }
  _mpp_log_l(2,"mpp_meta","found NULL input\n","mpp_meta_inc_ref");
  return MPP_ERR_NULL_PTR;
}

Assistant:

MPP_RET mpp_meta_inc_ref(MppMeta meta)
{
    if (NULL == meta) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppMetaImpl *impl = (MppMetaImpl *)meta;

    MPP_FETCH_ADD(&impl->ref_count, 1);
    return MPP_OK;
}